

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

string * CreateFlatBufferTest_abi_cxx11_(void)

{
  Offset<flatbuffers::String> name;
  Offset<flatbuffers::Vector<unsigned_char>_> inventory;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*>_> test4;
  Offset<MyGame::Example::Monster> OVar1;
  string *in_RDI;
  Vec3 local_d8;
  MonsterBuilder mb;
  Test tests [2];
  FlatBufferBuilder builder;
  uchar inv_data [10];
  
  flatbuffers::FlatBufferBuilder::FlatBufferBuilder(&builder,0x400);
  local_d8.x_ = 1.0;
  local_d8.y_ = 2.0;
  local_d8.z_ = 3.0;
  local_d8._12_6_ = 0;
  local_d8.test1_._2_2_ = 0;
  local_d8._20_6_ = 0;
  local_d8.test3_.a_ = 10;
  local_d8.test3_.b_ = '\x14';
  local_d8.test3_.__padding0 = '\0';
  local_d8.__padding2 = 0;
  name = flatbuffers::FlatBufferBuilder::CreateString(&builder,"MyMonster");
  inv_data[0] = '\0';
  inv_data[1] = '\x01';
  inv_data[2] = '\x02';
  inv_data[3] = '\x03';
  inv_data[4] = '\x04';
  inv_data[5] = '\x05';
  inv_data[6] = '\x06';
  inv_data[7] = '\a';
  inv_data[8] = '\b';
  inv_data[9] = '\t';
  inventory = flatbuffers::FlatBufferBuilder::CreateVector<unsigned_char>(&builder,inv_data,10);
  tests[0].a_ = 10;
  tests[0].b_ = '\x14';
  tests[0].__padding0 = '\0';
  tests[1].a_ = 0x1e;
  tests[1].b_ = '(';
  tests[1].__padding0 = '\0';
  test4 = flatbuffers::FlatBufferBuilder::CreateVectorOfStructs<MyGame::Example::Test>
                    (&builder,tests,2);
  mb.fbb_ = &builder;
  mb.start_ = flatbuffers::FlatBufferBuilder::StartTable(&builder);
  MyGame::Example::MonsterBuilder::add_hp(&mb,0x14);
  OVar1 = MyGame::Example::MonsterBuilder::Finish(&mb);
  OVar1 = MyGame::Example::CreateMonster
                    (&builder,&local_d8,0x96,0x50,name,inventory,'\x02','\x01',OVar1.o,test4);
  flatbuffers::FlatBufferBuilder::Finish<MyGame::Example::Monster>(&builder,OVar1);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>();
  flatbuffers::FlatBufferBuilder::~FlatBufferBuilder(&builder);
  return in_RDI;
}

Assistant:

std::string CreateFlatBufferTest() {
  flatbuffers::FlatBufferBuilder builder;

  auto vec = Vec3(1, 2, 3, 0, 0, Test(10, 20));

  auto name = builder.CreateString("MyMonster");

  unsigned char inv_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9 };
  auto inventory = builder.CreateVector(inv_data, 10);

  Test tests[] = { Test(10, 20), Test(30, 40) };
  auto testv = builder.CreateVectorOfStructs(tests, 2);

  // create monster with very few fields set:
  // (same functionality as CreateMonster below, but sets fields manually)
  MonsterBuilder mb(builder);
  mb.add_hp(20);
  auto mloc2 = mb.Finish();

  // shortcut for creating monster with all fields set:
  auto mloc = CreateMonster(builder, &vec, 150, 80, name, inventory, Color_Blue,
                            Any_Monster, mloc2.Union(), // Store a union.
                            testv);

  builder.Finish(mloc);

  #ifdef FLATBUFFERS_TEST_VERBOSE
  // print byte data for debugging:
  auto p = builder.GetBufferPointer();
  for (flatbuffers::uoffset_t i = 0; i < builder.GetSize(); i++)
    printf("%d ", p[i]);
  #endif

  // return the buffer for the caller to use.
  return std::string(reinterpret_cast<const char *>(builder.GetBufferPointer()),
                     builder.GetSize());
}